

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O2

void __thiscall kj::(anonymous_namespace)::AsyncPipe::BlockedPumpTo::write(BlockedPumpTo *this)

{
  size_t in_RCX;
  void *in_RDX;
  int in_ESI;
  
  anon_unknown_123::AsyncPipe::BlockedPumpTo::write((BlockedPumpTo *)this,in_ESI + -8,in_RDX,in_RCX)
  ;
  return;
}

Assistant:

Promise<void> write(ArrayPtr<const byte> writeBuffer) override {
      KJ_REQUIRE(canceler.isEmpty(), "already pumping");

      auto actual = kj::min(amount - pumpedSoFar, writeBuffer.size());
      return canceler.wrap(output.write(writeBuffer.first(actual))
          .then([this,actual,writeBuffer]() -> kj::Promise<void> {
        canceler.release();
        pumpedSoFar += actual;

        KJ_ASSERT(pumpedSoFar <= amount);
        KJ_ASSERT(actual <= writeBuffer.size());

        if (pumpedSoFar == amount) {
          // Done with pump.
          fulfiller.fulfill(kj::cp(pumpedSoFar));
          pipe.endState(*this);
        }

        if (actual == writeBuffer.size()) {
          return kj::READY_NOW;
        } else {
          KJ_ASSERT(pumpedSoFar == amount);
          return pipe.write(writeBuffer.slice(actual));
        }
      }, teeExceptionPromise<void>(fulfiller, canceler)));
    }